

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O1

int ATimes(void *Data,N_Vector v_vec,N_Vector z_vec)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  
  pdVar2 = (double *)N_VGetArrayPointer(v_vec);
  if (pdVar2 == (double *)0x0) {
    ATimes_cold_4();
  }
  else {
    pdVar3 = (double *)N_VGetArrayPointer(z_vec);
    if (pdVar3 == (double *)0x0) {
      ATimes_cold_3();
    }
    else {
      pdVar4 = (double *)N_VGetArrayPointer(*(undefined8 *)((long)Data + 0x10));
      if (pdVar4 == (double *)0x0) {
        ATimes_cold_2();
      }
      else {
        pdVar5 = (double *)N_VGetArrayPointer(*(undefined8 *)((long)Data + 0x18));
        if (pdVar5 != (double *)0x0) {
          lVar1 = *Data;
          *pdVar3 = (*pdVar2 * 5.0 * *pdVar5 - pdVar5[1] * pdVar2[1]) / *pdVar4;
          if (2 < lVar1) {
            lVar6 = 0;
            do {
              pdVar3[lVar6 + 1] =
                   ((pdVar2[lVar6 + 1] * 5.0 * pdVar5[lVar6 + 1] - pdVar2[lVar6] * pdVar5[lVar6]) -
                   pdVar2[lVar6 + 2] * pdVar5[lVar6 + 2]) / pdVar4[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while (lVar1 + -2 != lVar6);
          }
          pdVar3[lVar1 + -1] =
               (pdVar2[lVar1 + -1] * 5.0 * pdVar5[lVar1 + -1] -
               pdVar2[lVar1 + -2] * pdVar5[lVar1 + -2]) / pdVar4[lVar1 + -1];
          return 0;
        }
        ATimes_cold_1();
      }
    }
  }
  return 1;
}

Assistant:

int ATimes(void* Data, N_Vector v_vec, N_Vector z_vec)
{
  /* local variables */
  sunrealtype *v, *z, *s1, *s2;
  sunindextype i, N;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  v        = N_VGetArrayPointer(v_vec);
  if (check_flag(v, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  s1 = N_VGetArrayPointer(ProbData->s1);
  if (check_flag(s1, "N_VGetArrayPointer", 0)) { return 1; }
  s2 = N_VGetArrayPointer(ProbData->s2);
  if (check_flag(s2, "N_VGetArrayPointer", 0)) { return 1; }
  N = ProbData->N;

  /* perform product at the left domain boundary (note: v is zero at the boundary)*/
  z[0] = (FIVE * v[0] * s2[0] - v[1] * s2[1]) / s1[0];

  /* iterate through interior of the domain, performing product */
  for (i = 1; i < N - 1; i++)
  {
    z[i] = (-v[i - 1] * s2[i - 1] + FIVE * v[i] * s2[i] - v[i + 1] * s2[i + 1]) /
           s1[i];
  }

  /* perform product at the right domain boundary (note: v is zero at the boundary)*/
  z[N - 1] = (-v[N - 2] * s2[N - 2] + FIVE * v[N - 1] * s2[N - 1]) / s1[N - 1];

  /* return with success */
  return 0;
}